

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::DictionaryType::~DictionaryType(DictionaryType *this)

{
  DictionaryType *this_local;
  
  ~DictionaryType(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

DictionaryType::~DictionaryType() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.DictionaryType)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}